

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter.cpp
# Opt level: O0

double testExtendedKalmanFilter(void)

{
  Index *other;
  Scalar SVar1;
  int iVar2;
  Index IVar3;
  Matrix<double,__1,_1,_0,__1,_1> *other_00;
  ulong uVar4;
  long lVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  RealScalar RVar8;
  Index *local_c0d8;
  Index *local_c0a8;
  Index *local_c090;
  Index *local_bfa8;
  Index *local_bf88;
  Index *local_bf68;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_bf60;
  undefined1 local_bf48 [8];
  StateVector error;
  undefined1 local_bf28 [8];
  Cmatrix c;
  Amatrix a;
  Index i;
  Matrix<double,__1,_1,_0,__1,_1> local_bee8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_bed8;
  undefined1 local_beb0 [8];
  StateVector dx;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_be98;
  undefined1 local_be88 [8];
  Qmatrix q;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_be68;
  undefined1 local_be58 [8];
  Rmatrix r;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  local_be38;
  uint local_be24;
  undefined1 local_be20 [4];
  uint i_1;
  Pmatrix p;
  StateVector xh;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_bde8;
  Matrix<double,__1,_1,_0,__1,_1> local_bdd0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_bdc0;
  Matrix<double,__1,__1,_0,__1,__1> local_bda8;
  Matrix<double,__1,_1,_0,__1,_1> local_bd90;
  undefined1 local_bd80 [8];
  MeasureVector w;
  Matrix<double,__1,_1,_0,__1,_1> local_bd58;
  undefined1 local_bd48 [8];
  StateVector v;
  long local_bd28;
  Index k;
  undefined1 local_bd10 [8];
  StateVector x;
  KalmanFunctor func;
  Matrix<double,__1,__1,_0,__1,__1> local_bc80;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_bc68;
  undefined1 local_bc40 [8];
  Qmatrix q1;
  Matrix<double,__1,__1,_0,__1,__1> local_bc20;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_bc08;
  undefined1 local_bbe0 [8];
  Rmatrix r1;
  InputVector uk [1001];
  MeasureVector yk [1000];
  StateVector xk [1001];
  
  if (testExtendedKalmanFilter()::f == '\0') {
    iVar2 = __cxa_guard_acquire(&testExtendedKalmanFilter()::f);
    if (iVar2 != 0) {
      stateObservation::ExtendedKalmanFilter::ExtendedKalmanFilter
                ((ExtendedKalmanFilter *)testExtendedKalmanFilter()::f,4,3,1,true,true);
      __cxa_atexit(stateObservation::ExtendedKalmanFilter::~ExtendedKalmanFilter,
                   testExtendedKalmanFilter()::f,&__dso_handle);
      __cxa_guard_release(&testExtendedKalmanFilter()::f);
    }
  }
  local_bf68 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bf68);
    local_bf68 = local_bf68 + 2;
  } while (local_bf68 !=
           &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_bf88 = &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bf88);
    local_bf88 = local_bf88 + 2;
  } while (local_bf88 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  local_bfa8 = &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
  ;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bfa8);
    local_bfa8 = local_bfa8 + 2;
  } while (local_bfa8 !=
           &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  stateObservation::KalmanFilterBase::getRmatrixRandom();
  q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_bc08,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc20,
             (double *)
             &q1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_bbe0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_bc08);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_bc20);
  stateObservation::KalmanFilterBase::getQmatrixRandom();
  func.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3f847ae147ae147b;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
            (&local_bc68,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_bc80,
             (double *)
             &func.c_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_bc40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_bc68);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_bc80);
  testExtendedKalmanFilter::KalmanFunctor::KalmanFunctor
            ((KalmanFunctor *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  stateObservation::ObserverBase::stateVectorZero();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)local_bd10);
  stateObservation::ObserverBase::inputVectorRandom();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (Matrix<double,__1,_1,_0,__1,_1> *)&k);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&k);
  for (local_bd28 = 1; local_bd28 < 0x3e9; local_bd28 = local_bd28 + 1) {
    stateObservation::ObserverBase::inputVectorRandom();
    other = &v.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &uk[local_bd28 + -1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)other);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)other);
    stateObservation::ObserverBase::stateVectorZero();
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (Matrix<double,__1,__1,_0,__1,__1> *)local_bc40);
    IVar3 = stateObservation::ObserverBase::getStateSize();
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              ((ProbabilityLawSimulation *)local_bd48,&local_bd58,
               (Matrix<double,__1,__1,_0,__1,__1> *)
               &w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               IVar3,1);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &w.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_bd58);
    stateObservation::ObserverBase::measureVectorZero();
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (&local_bda8,(Matrix<double,__1,__1,_0,__1,__1> *)local_bbe0);
    IVar3 = stateObservation::ObserverBase::getMeasureSize();
    stateObservation::tools::ProbabilityLawSimulation::
    getGaussianMatrix<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              ((ProbabilityLawSimulation *)local_bd80,&local_bd90,&local_bda8,IVar3,1);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_bda8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_bd90);
    testExtendedKalmanFilter()::KalmanFunctor::stateDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              (&local_bdd0,
               (StateVector *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (InputVector *)local_bd10,
               (TimeIndex)
               &uk[local_bd28 + -2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_bdc0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_bdd0,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_bd48);
    other_00 = Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                         ((Matrix<double,_1,1,0,_1,1> *)local_bd10,
                          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&local_bdc0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &yk[local_bd28 + 999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,other_00);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_bdd0);
    testExtendedKalmanFilter()::KalmanFunctor::measureDynamics(Eigen::
    Matrix<double,-1,1,0,-1,1>const&,Eigen::Matrix<double,_1,1,0,_1,1>_const__long_
              (&xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (StateVector *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (InputVector *)local_bd10,
               (TimeIndex)
               &uk[local_bd28 + -1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_bde8,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_bd80);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,_1,1,0,_1,1> *)
               &uk[local_bd28 + 999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_bde8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &xh.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bd80);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bd48);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bd10);
  stateObservation::ExtendedKalmanFilter::setFunctor
            ((DynamicalSystemFunctorBase *)testExtendedKalmanFilter()::f);
  stateObservation::ObserverBase::stateVectorRandom();
  stateObservation::ZeroDelayObserver::setState
            ((Matrix *)testExtendedKalmanFilter()::f,
             (long)&yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_rows);
  stateObservation::KalmanFilterBase::getPmatrixZero();
  local_be24 = 0;
  while( true ) {
    uVar4 = (ulong)local_be24;
    lVar5 = stateObservation::ObserverBase::getStateSize();
    if (lVar5 <= (long)uVar4) break;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(ulong)local_be24);
    SVar1 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_be20,
                        (ulong)local_be24,(ulong)local_be24);
    *pSVar7 = SVar1;
    local_be24 = local_be24 + 1;
  }
  r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_be20);
  local_be38 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_be20,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&r.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)local_be20,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_be38);
  stateObservation::KalmanFilterBase::setStateCovariance((Matrix *)testExtendedKalmanFilter()::f);
  q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_bbe0);
  local_be68 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_bbe0,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&q.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_be58,&local_be68);
  dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_bc40);
  local_be98 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_bc40,
                          (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)&dx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_be88,&local_be98);
  stateObservation::KalmanFilterBase::setR((Matrix *)testExtendedKalmanFilter()::f);
  stateObservation::KalmanFilterBase::setQ((Matrix *)testExtendedKalmanFilter()::f);
  stateObservation::ZeroDelayObserver::setInput
            ((Matrix *)testExtendedKalmanFilter()::f,
             (long)&r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_cols);
  stateObservation::ObserverBase::stateVectorConstant(1.0);
  i = 0x3e45798ee2308c3a;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (&local_bed8,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_bee8,(double *)&i);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_beb0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_bed8);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_bee8);
  for (a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
      a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols < 0x3e9;
      a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols + 1)
  {
    stateObservation::ZeroDelayObserver::setMeasurement
              ((Matrix *)testExtendedKalmanFilter()::f,
               (long)&uk[a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols + 999].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows);
    stateObservation::ZeroDelayObserver::setInput
              ((Matrix *)testExtendedKalmanFilter()::f,
               (long)&uk[a.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols + -1].
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows);
    stateObservation::ExtendedKalmanFilter::getAMatrixFD
              ((Matrix *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
    stateObservation::ExtendedKalmanFilter::getCMatrixFD((Matrix *)local_bf28);
    stateObservation::KalmanFilterBase::setA((Matrix *)testExtendedKalmanFilter()::f);
    stateObservation::KalmanFilterBase::setC((Matrix *)testExtendedKalmanFilter()::f);
    stateObservation::ZeroDelayObserver::getEstimatedState
              ((long)&error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &error.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_bf28);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)
               &c.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols)
    ;
  }
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
            (&local_bf60,
             (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &xk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_bf48,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_bf60);
  RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_bf48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_bf48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_beb0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_be88)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_be58)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_be20)
  ;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &p.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  testExtendedKalmanFilter::KalmanFunctor::~KalmanFunctor
            ((KalmanFunctor *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_bc40)
  ;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_bbe0)
  ;
  local_c090 = &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_c090 = local_c090 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c090);
  } while (local_c090 !=
           &r1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols);
  local_c0a8 = &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_c0a8 = local_c0a8 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c0a8);
  } while (local_c0a8 !=
           &uk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          );
  local_c0d8 = &xk[1000].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows;
  do {
    local_c0d8 = local_c0d8 + -2;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c0d8);
  } while (local_c0d8 !=
           &yk[999].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
  ;
  return RVar8;
}

Assistant:

double testExtendedKalmanFilter()
{
  /// the number of samples
  const static stateObservation::Index kmax = 1000;

  /// define the type of the extended Kalman filter
  typedef stateObservation::ExtendedKalmanFilter ekf;

  /// instanciation of the extended Kalman filter
  static ekf f(4, 3, 1);

  /// The functor that describes the dynamics of the state
  /// and the measurement
  class KalmanFunctor : public stateObservation::DynamicalSystemFunctorBase
  {

  public:
    /// Constructor
    KalmanFunctor()
    {
      s_ = f.stateVectorRandom() * 0.1;
      m_ = f.measureVectorRandom() * 0.1;
      t_ = f.stateVectorRandom();
      n_ = f.measureVectorRandom();
      a_ = f.getAmatrixRandom() * 0.6;
      c_ = f.getCmatrixRandom();
    }

    /// The dynamics of the state xk1=f(xk,u,k)
    virtual ekf::StateVector stateDynamics(const ekf::StateVector & xk,
                                           const ekf::InputVector & u,
                                           stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::StateVector xk1;

      xk1 = a_ * xk + cos(10 * (xk.transpose() * xk)[0]) * s_ + t_ + (u.transpose() * u)(0, 0) * s_;
      return xk1;
    }

    /// The dynamics of the state yk=h(xk,u,k)
    virtual ekf::MeasureVector measureDynamics(const ekf::StateVector & xk,
                                               const ekf::InputVector & u,
                                               stateObservation::TimeIndex k)
    {
      (void)k; // unused
      (void)u; // unused

      ekf::MeasureVector yk;
      yk = c_ * xk + cos(10 * (xk.transpose() * xk)[0]) * m_ + n_;
      return yk;
    }

    virtual stateObservation::Index getStateSize() const
    {
      return f.getStateSize();
    }

    virtual stateObservation::Index getInputSize() const
    {
      return f.getInputSize();
    }

    virtual stateObservation::Index getMeasurementSize() const
    {
      return f.getMeasureSize();
    }

  private:
    /// containers for the vectors and matrices
    ekf::StateVector s_;
    ekf::StateVector t_;
    ekf::MeasureVector m_;
    ekf::MeasureVector n_;

    ekf::Amatrix a_;
    ekf::Cmatrix c_;
  };

  /// containers for the state, the measurements and the input
  ekf::StateVector xk[kmax + 1];
  ekf::MeasureVector yk[kmax];
  ekf::InputVector uk[kmax + 1];

  /// the standard deviation matrix to generate the gaussian noise
  ekf::Rmatrix r1 = f.getRmatrixRandom() * 0.01;
  ekf::Qmatrix q1 = f.getQmatrixRandom() * 0.01;

  /// instanciate the functor
  KalmanFunctor func;

  { /// Construction of the sequence of states measurements and inputs

    /// initializations
    ekf::StateVector x = f.stateVectorZero();
    xk[0] = x;
    uk[0] = f.inputVectorRandom();

    for(stateObservation::Index k = 1; k <= kmax; ++k)
    {
      /// generation of random inputs
      uk[k] = f.inputVectorRandom();

      /// generation of Gaussian white noises
      ekf::StateVector v = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(f.stateVectorZero(), q1,
                                                                                                f.getStateSize(), 1);

      ekf::MeasureVector w = stateObservation::tools::ProbabilityLawSimulation::getGaussianMatrix(
          f.measureVectorZero(), r1, f.getMeasureSize());

      /// the dynamics is executed here
      xk[k] = x = func.stateDynamics(x, uk[k - 1], k - 1) + v;
      yk[k - 1] = func.measureDynamics(x, uk[k], k) + w;
    }
  }

  /// set the functor of the extended Kalman filter
  f.setFunctor(&func);

  /// generation of a random initial estimation of the state
  ekf::StateVector xh = f.stateVectorRandom();

  /// set the initial state of the estimator
  f.setState(xk[0], 0);

  /// set the covariance matrix of the initial estimation error
  ekf::Pmatrix p = f.getPmatrixZero();
  for(unsigned i = 0; i < f.getStateSize(); ++i)
  {
    p(i, i) = xh[i];
  }
  p = p * p.transpose();
  f.setStateCovariance(p);

  /// the covariance matrices for the process noise and the measurements noise
  ekf::Rmatrix r(r1 * r1.transpose());
  ekf::Qmatrix q(q1 * q1.transpose());

  /// set the covariance matrices for the extended Kalman filter
  f.setR(r);
  f.setQ(q);

  /// set initial input
  f.setInput(uk[0], 0);

  /// set the derivation step for the finite difference method
  ekf::StateVector dx = f.stateVectorConstant(1) * 1e-8;

  stateObservation::Index i;
  for(i = 1; i <= kmax; ++i)
  {
    /// give the measurements and the inputs at instant i to the ekf
    f.setMeasurement(yk[i - 1], i);
    f.setInput(uk[i], i);

    /// obtain jacobians by finite differences method
    ekf::Amatrix a = f.getAMatrixFD(dx);
    ekf::Cmatrix c = f.getCMatrixFD(dx);

    /// set the jacobians to the ekf
    f.setA(a);
    f.setC(c);

    /// get the estimation of the state at instant i;
    xh = f.getEstimatedState(i);
  }

  ekf::StateVector error = xh - xk[kmax];

  return error.norm();
}